

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O2

bool __thiscall IR::PropertySymOpnd::SetMonoGuardType(PropertySymOpnd *this,JITTypeHolder type)

{
  JITTypeHolder *this_00;
  bool bVar1;
  EquivalentTypeSet *this_01;
  nullptr_t local_30;
  JITTypeHolderBase<void> local_28;
  JITTypeHolderBase<void> local_20;
  JITTypeHolder type_local;
  
  this_00 = &this->monoGuardType;
  local_30 = (nullptr_t)0x0;
  local_20.t = type.t;
  bVar1 = JITTypeHolderBase<void>::operator==(this_00,&local_30);
  if ((bVar1) || (bVar1 = JITTypeHolderBase<void>::operator==(this_00,&local_20), bVar1)) {
    bVar1 = HasEquivalentTypeSet(this);
    if (bVar1) {
      this_01 = GetEquivalentTypeSet(this);
      bVar1 = Js::EquivalentTypeSet::Contains(this_01,(JITTypeHolder)local_20.t,(uint16 *)0x0);
      if (bVar1) goto LAB_003da306;
    }
    bVar1 = HasEquivalentTypeSet(this);
    if (!bVar1) {
      local_28.t = (Type)GetType(this);
      bVar1 = JITTypeHolderBase<void>::operator==(&local_28,&local_20);
      if (bVar1) {
LAB_003da306:
        this_00->t = local_20.t;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SetMonoGuardType(JITTypeHolder type)
    {
        if (!(this->monoGuardType == nullptr || this->monoGuardType == type) ||
            !((HasEquivalentTypeSet() && GetEquivalentTypeSet()->Contains(type)) ||
              (!HasEquivalentTypeSet() && GetType() == type)))
        {
            // Required type is not in the available set, or we already set the type to something else. Inform the caller.
            return false;
        }
        this->monoGuardType = type;
        return true;
    }